

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mock.hpp
# Opt level: O3

void __thiscall
ut11::Mock<int(char)>::VerifyTimes<int,char>
          (Mock<int(char)> *this,size_t param_2,long *param_3,int *param_4,Mock<int(char)> *param_5)

{
  const_iterator __end0;
  Mock<int(char)> *pMVar1;
  size_t actual;
  string local_68;
  string local_48;
  
  pMVar1 = *(Mock<int(char)> **)(this + 0x20);
  if (pMVar1 == this + 0x20) {
    actual = 0;
  }
  else {
    actual = 0;
    do {
      actual = actual + (pMVar1[0x10] == *param_5);
      pMVar1 = *(Mock<int(char)> **)pMVar1;
    } while (pMVar1 != this + 0x20);
  }
  if (actual != (long)*param_4) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_68,*param_3,param_3[1] + *param_3);
    GetVerifyFailTimesMessageForCount_abi_cxx11_(&local_48,this,(long)*param_4,actual);
    Assert::Fail(param_2,&local_68,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void VerifyTimes(std::true_type isOperand, std::size_t line, std::string file, const Count& count, const Expectations&... expectations) const
		{
			auto actual = m_argumentHandler.CountCalls(expectations...);
			if ( actual != count )
				Assert::Fail(line, file, GetVerifyFailTimesMessageForCount(count, actual));
		}